

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.h
# Opt level: O3

void __thiscall String::append(String *this,String *ba)

{
  pointer pcVar1;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  pcVar1 = (ba->mString)._M_dataplus._M_p;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,pcVar1,pcVar1 + (ba->mString)._M_string_length);
  std::__cxx11::string::_M_append((char *)this,(ulong)local_38[0]);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  return;
}

Assistant:

void append(const String &ba)
    {
        mString.append(ba);
    }